

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::TextLabel::minimumSizeHint(TextLabel *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QTextDocument doc;
  QArrayData *local_70 [2];
  long local_60;
  QString local_58;
  undefined8 uStack_40;
  double local_38;
  
  QStaticText::text();
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,8);
    }
  }
  if (local_60 == 0) {
    iVar1 = QFrame::frameWidth();
    iVar2 = QFrame::frameWidth();
    local_58.d.size._4_4_ = iVar2 * 2;
    local_58.d.size._0_4_ = iVar1 * 2;
  }
  else {
    auVar4 = QWidget::contentsMargins();
    QTextDocument::QTextDocument((QTextDocument *)&local_58,(QObject *)0x0);
    QStaticText::text();
    QTextDocument::setHtml(&local_58);
    if (local_70[0] != (QArrayData *)0x0) {
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70[0],2,8);
      }
    }
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)&local_58);
    QTextOption::~QTextOption((QTextOption *)local_70);
    QFontMetrics::QFontMetrics
              ((QFontMetrics *)local_70,(QFont *)(*(long *)&this->field_0x20 + 0x38));
    iVar1 = QFontMetrics::averageCharWidth();
    QTextDocument::setTextWidth((double)(iVar1 * 10));
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_70);
    auVar5 = QTextDocument::size();
    local_38 = auVar5._8_8_;
    local_58.d.size = auVar5._0_8_;
    iVar1 = QFrame::frameWidth();
    dVar3 = (double)(((this->d).d)->margin * 2);
    local_58.d.size._0_4_ =
         (int)(dVar3 + (double)auVar4._8_4_ +
                       (double)auVar4._0_4_ + (double)(iVar1 * 2) + (double)local_58.d.size);
    local_58.d.size._4_4_ =
         (int)(dVar3 + (double)auVar4._12_4_ + (double)auVar4._4_4_ + (double)(iVar1 * 2) + local_38
              );
    uStack_40 = 0;
    QTextDocument::~QTextDocument((QTextDocument *)&local_58);
  }
  return (QSize)local_58.d.size;
}

Assistant:

QSize
TextLabel::minimumSizeHint() const
{
	if( text().isEmpty() )
		return QSize( 2 * frameWidth(), 2 * frameWidth() );

	const QMargins margins = contentsMargins();

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setDefaultTextOption( d->staticText.textOption() );
	doc.setTextWidth( fontMetrics().averageCharWidth() * 10 );

	const QSizeF size = doc.size();
	const int frame = 2 * frameWidth();

	return QSize( size.width() + frame + margins.left() + margins.right() +
		2 * d->margin,
		size.height() + frame + margins.top() + margins.bottom() +
		2 * d->margin );
}